

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_c.c
# Opt level: O3

int main(void)

{
  FILE *__stream;
  FILE *__stream_00;
  FILE *__stream_01;
  FILE *__stream_02;
  FILE *udata;
  qpdflogger_handle l_00;
  qpdflogger_handle l;
  qpdflogger_handle local_38;
  
  __stream = (FILE *)do_fopen("info");
  __stream_00 = (FILE *)do_fopen("warn");
  __stream_01 = (FILE *)do_fopen("error");
  __stream_02 = (FILE *)do_fopen("save");
  udata = do_fopen("save2");
  l_00 = qpdflogger_default_logger();
  local_38 = l_00;
  qpdflogger_set_info(l_00,qpdf_log_dest_custom,fn,__stream);
  qpdflogger_set_warn(l_00,qpdf_log_dest_custom,fn,__stream_00);
  qpdflogger_set_error(l_00,qpdf_log_dest_custom,fn,__stream_01);
  qpdflogger_set_save(l_00,qpdf_log_dest_custom,fn,__stream_02,0);
  do_run("{\"inputFile\": \"normal.pdf\", \"showNpages\": \"\"}",0);
  do_run("{\"inputFile\": \"warning.pdf\", \"showNpages\": \"\"}",3);
  do_run("{\"inputFile\": \"missing.pdf\", \"showNpages\": \"\"}",2);
  do_run("{\"inputFile\": \"normal.pdf\", \"staticId\": \"\", \"streamData\": \"uncompress\", \"outputFile\": \"-\"}"
         ,0);
  fclose(__stream);
  fclose(__stream_00);
  fclose(__stream_01);
  fclose(__stream_02);
  qpdflogger_set_info(l_00,qpdf_log_dest_stderr,(qpdf_log_fn_t)0x0,(void *)0x0);
  qpdflogger_set_warn(l_00,qpdf_log_dest_stdout,(qpdf_log_fn_t)0x0,(void *)0x0);
  qpdflogger_set_error(l_00,qpdf_log_dest_default,(qpdf_log_fn_t)0x0,(void *)0x0);
  qpdflogger_set_save(l_00,qpdf_log_dest_custom,fn,udata,0);
  do_run("{\"inputFile\": \"2pages.pdf\", \"showNpages\": \"\"}",0);
  do_run("{\"inputFile\": \"warning.pdf\", \"showNpages\": \"\"}",3);
  do_run("{\"inputFile\": \"missing.pdf\", \"showNpages\": \"\"}",2);
  do_run("{\"inputFile\": \"attach.pdf\", \"showAttachment\": \"a\"}",0);
  qpdflogger_save_to_standard_output(l_00,1);
  do_run("{\"inputFile\": \"attach.pdf\", \"showAttachment\": \"a\"}",0);
  qpdflogger_cleanup(&local_38);
  return 0;
}

Assistant:

int
main()
{
    FILE* info = do_fopen("info");
    FILE* warn = do_fopen("warn");
    FILE* error = do_fopen("error");
    FILE* save = do_fopen("save");
    FILE* save2 = do_fopen("save2");
    qpdflogger_handle l = qpdflogger_default_logger();

    qpdflogger_set_info(l, qpdf_log_dest_custom, fn, (void*)info);
    qpdflogger_set_warn(l, qpdf_log_dest_custom, fn, (void*)warn);
    qpdflogger_set_error(l, qpdf_log_dest_custom, fn, (void*)error);
    qpdflogger_set_save(l, qpdf_log_dest_custom, fn, (void*)save, 0);

    do_run("{\"inputFile\": \"normal.pdf\", \"showNpages\": \"\"}", qpdf_exit_success);
    do_run("{\"inputFile\": \"warning.pdf\", \"showNpages\": \"\"}", qpdf_exit_warning);
    do_run("{\"inputFile\": \"missing.pdf\", \"showNpages\": \"\"}", qpdf_exit_error);
    do_run(
        "{\"inputFile\": \"normal.pdf\","
        " \"staticId\": \"\","
        " \"streamData\": \"uncompress\","
        " \"outputFile\": \"-\"}",
        qpdf_exit_success);

    fclose(info);
    fclose(warn);
    fclose(error);
    fclose(save);

    qpdflogger_set_info(l, qpdf_log_dest_stderr, NULL, NULL);
    qpdflogger_set_warn(l, qpdf_log_dest_stdout, NULL, NULL);
    qpdflogger_set_error(l, qpdf_log_dest_default, NULL, NULL);
    qpdflogger_set_save(l, qpdf_log_dest_custom, fn, (void*)save2, 0);

    do_run("{\"inputFile\": \"2pages.pdf\", \"showNpages\": \"\"}", qpdf_exit_success);
    do_run("{\"inputFile\": \"warning.pdf\", \"showNpages\": \"\"}", qpdf_exit_warning);
    do_run("{\"inputFile\": \"missing.pdf\", \"showNpages\": \"\"}", qpdf_exit_error);
    do_run(
        "{\"inputFile\": \"attach.pdf\","
        " \"showAttachment\": \"a\"}",
        qpdf_exit_success);

    /* This won't change save since it's already set */
    qpdflogger_save_to_standard_output(l, 1);
    do_run(
        "{\"inputFile\": \"attach.pdf\","
        " \"showAttachment\": \"a\"}",
        qpdf_exit_success);

    qpdflogger_cleanup(&l);

    return 0;
}